

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O0

void __thiscall SetMeaning::Dump(SetMeaning *this,ostream *out)

{
  Activation *pAVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *out_local;
  SetMeaning *this_local;
  
  bVar2 = Sexp::IsMeaning(this->binding_value);
  if (!bVar2) {
    __assert_fail("binding_value->IsMeaning()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                  ,0xa6,"virtual void SetMeaning::Dump(std::ostream &)");
  }
  poVar3 = std::operator<<(out,"(meaning-set ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->up_index);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->right_index);
  std::operator<<(poVar3," ");
  pAVar1 = (this->binding_value->field_1).activation;
  (*(code *)(pAVar1->parent->field_1).symbol_value)(pAVar1,out);
  std::operator<<(out,")");
  return;
}

Assistant:

void Dump(std::ostream &out) override {
    assert(binding_value->IsMeaning());
    out << "(meaning-set " << up_index << " " << right_index << " ";
    binding_value->meaning->Dump(out);
    out << ")";
  }